

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwo.cpp
# Opt level: O2

ChConstraintTwo * __thiscall
chrono::ChConstraintTwo::operator=(ChConstraintTwo *this,ChConstraintTwo *other)

{
  ChVariables *pCVar1;
  
  if (other != this) {
    ChConstraint::operator=(&this->super_ChConstraint,&other->super_ChConstraint);
    pCVar1 = other->variables_b;
    this->variables_a = other->variables_a;
    this->variables_b = pCVar1;
  }
  return this;
}

Assistant:

ChConstraintTwo& ChConstraintTwo::operator=(const ChConstraintTwo& other) {
    if (&other == this)
        return *this;

    // copy parent class data
    ChConstraint::operator=(other);

    this->variables_a = other.variables_a;
    this->variables_b = other.variables_b;

    return *this;
}